

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_unit_test.cpp
# Opt level: O2

void __thiscall
simplex_tree_insertion<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>::test_method
          (simplex_tree_insertion<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_> *this)

{
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
  *ppVar1;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  vVar2;
  __node_base _Var3;
  float fVar4;
  pointer pvVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  Filtration_value *pFVar9;
  Siblings *__return_storage_ptr__;
  float fVar10;
  pointer pvVar11;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<unsigned_long> __l_10;
  typePairSimplexBool returnValue;
  allocator_type local_931;
  undefined1 local_930 [8];
  char *local_928;
  __node_base _Stack_920;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *local_918;
  typeSimplex eleventhSimplex;
  typeSimplex ninethSimplex;
  typeSimplex eighthSimplex;
  typeSimplex seventhSimplex;
  typeSimplex sixthSimplex;
  typeSimplex fifthSimplex;
  typeSimplex fourthSimplex;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
  *local_830;
  pointer local_828;
  shared_count sStack_820;
  typeSimplex tenthSimplex;
  typeSimplex thirdSimplex;
  typeVectorVertex eleventhSimplexVector;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_7c0;
  typeSimplex secondSimplex;
  Simplex_tree<Gudhi::Simplex_tree_options_default> st;
  typeVectorVertex ninethSimplexVector;
  typeVectorVertex eighthSimplexVector;
  typeVectorVertex seventhSimplexVector;
  typeVectorVertex sixthSimplexVector;
  typeVectorVertex fifthSimplexVector;
  typeVectorVertex fourthSimplexVector;
  typeVectorVertex thirdSimplexVector;
  typeVectorVertex secondSimplexVector;
  typeVectorVertex firstSimplexVector;
  Simplex_handle local_620;
  typeVectorVertex tenthSimplexVector;
  typeSimplex firstSimplex;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_5e0;
  char *local_5c8;
  char *local_5c0;
  __node_base local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  unsigned_long local_48 [3];
  
  dim_max = -1;
  poVar8 = std::operator<<((ostream *)&std::clog,
                           "********************************************************************");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&std::clog,"TEST OF INSERTION");
  std::endl<char,std::char_traits<char>>(poVar8);
  st.nodes_label_to_list_._M_h._M_buckets = &st.nodes_label_to_list_._M_h._M_single_bucket;
  st.nodes_label_to_list_._M_h._M_bucket_count = 1;
  st.nodes_label_to_list_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  st.nodes_label_to_list_._M_h._M_element_count = 0;
  st.nodes_label_to_list_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  st.nodes_label_to_list_._M_h._M_rehash_policy._M_next_resize = 0;
  st.nodes_label_to_list_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  st.null_vertex_ = -1;
  st.root_.oncles_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        *)0x0;
  st.root_.parent_ = -1;
  st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
  st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
  st.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  st.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  st.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  st.dimension_ = -1;
  st.dimension_to_be_lowered_ = false;
  poVar8 = std::operator<<((ostream *)&std::clog,"   - INSERT 0");
  std::endl<char,std::char_traits<char>>(poVar8);
  firstSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)firstSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  __l._M_len = 1;
  __l._M_array = (iterator)&firstSimplex;
  std::vector<int,_std::allocator<int>_>::vector
            (&firstSimplexVector,__l,(allocator_type *)&secondSimplex);
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_58,0xd3);
  secondSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(secondSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               (long)firstSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)firstSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start == 4);
  secondSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  secondSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  firstSimplex.second = (double)&thirdSimplex;
  thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_944f0;
  thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x18134e;
  firstSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  firstSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  firstSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_70 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &secondSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector(&firstSimplex.first,&firstSimplexVector);
  firstSimplex.second = 0.1;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&returnValue,
             (vector<int,_std::allocator<int>_> *)&st,(Filtration_value *)&firstSimplex);
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            (&returnValue);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            (&st,(int)((ulong)((long)firstSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)firstSimplexVector.super__Vector_base<int,_std::allocator<int>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2),
             &firstSimplex.second);
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0xd9);
  thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 1);
  thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_944fc;
  fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x18136e;
  secondSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)secondSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  secondSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  secondSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_a0 = "";
  secondSimplex.second = (double)&fourthSimplex;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  poVar8 = std::operator<<((ostream *)&std::clog,"   - INSERT 1");
  std::endl<char,std::char_traits<char>>(poVar8);
  secondSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(secondSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&secondSimplex;
  std::vector<int,_std::allocator<int>_>::vector
            (&secondSimplexVector,__l_00,(allocator_type *)&thirdSimplex);
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0xde);
  thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               (long)secondSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)secondSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start == 4);
  thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_94514;
  fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x18139c;
  secondSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)secondSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  secondSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  secondSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_d0 = "";
  secondSimplex.second = (double)&fourthSimplex;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector(&secondSimplex.first,&secondSimplexVector);
  secondSimplex.second = 0.1;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&thirdSimplex,
             (vector<int,_std::allocator<int>_> *)&st,(Filtration_value *)&secondSimplex);
  returnValue.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start;
  returnValue.second =
       (bool)thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish._0_1_;
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            (&returnValue);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            (&st,(int)((ulong)((long)secondSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)secondSimplexVector.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2),&secondSimplex.second);
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0xe4);
  fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 2);
  fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_94520;
  fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x1813bc;
  thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_100 = "";
  thirdSimplex.second = (double)&fifthSimplex;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  poVar8 = std::operator<<((ostream *)&std::clog,"   - INSERT (0,1)");
  std::endl<char,std::char_traits<char>>(poVar8);
  thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x100000000;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&thirdSimplex;
  std::vector<int,_std::allocator<int>_>::vector
            (&thirdSimplexVector,__l_01,(allocator_type *)&fourthSimplex);
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0xe9);
  fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               (long)thirdSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)thirdSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start == 8);
  fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_94538;
  fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x1813ed;
  thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  thirdSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_130 = "";
  thirdSimplex.second = (double)&fifthSimplex;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector(&thirdSimplex.first,&thirdSimplexVector);
  thirdSimplex.second = 0.2;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&fourthSimplex,
             (vector<int,_std::allocator<int>_> *)&st,(Filtration_value *)&thirdSimplex);
  returnValue.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start;
  returnValue.second =
       (bool)fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish._0_1_;
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            (&returnValue);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            (&st,(int)((ulong)((long)thirdSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)thirdSimplexVector.super__Vector_base<int,_std::allocator<int>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2),
             &thirdSimplex.second);
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0xef);
  fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 2);
  fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_94520;
  sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x1813bc;
  fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_160 = "";
  fourthSimplex.second = (double)&sixthSimplex;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  poVar8 = std::operator<<((ostream *)&std::clog,"   - INSERT 2");
  std::endl<char,std::char_traits<char>>(poVar8);
  fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,2);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&fourthSimplex;
  std::vector<int,_std::allocator<int>_>::vector
            (&fourthSimplexVector,__l_02,(allocator_type *)&fifthSimplex);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0xf4);
  fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               (long)fourthSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)fourthSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start == 4);
  fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_94550;
  sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x18141b;
  fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  fourthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_190 = "";
  fourthSimplex.second = (double)&sixthSimplex;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector(&fourthSimplex.first,&fourthSimplexVector);
  fourthSimplex.second = 0.1;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&fifthSimplex,
             (vector<int,_std::allocator<int>_> *)&st,(Filtration_value *)&fourthSimplex);
  returnValue.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start;
  returnValue.second =
       (bool)fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish._0_1_;
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            (&returnValue);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            (&st,(int)((ulong)((long)fourthSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)fourthSimplexVector.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2),&fourthSimplex.second);
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a8,0xfa);
  sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 3);
  sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)anon_var_dwarf_9455c;
  seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x18143b;
  fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_1c0 = "";
  fifthSimplex.second = (double)&seventhSimplex;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  poVar8 = std::operator<<((ostream *)&std::clog,"   - INSERT (2,0)");
  std::endl<char,std::char_traits<char>>(poVar8);
  fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x2;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&fifthSimplex;
  std::vector<int,_std::allocator<int>_>::vector
            (&fifthSimplexVector,__l_03,(allocator_type *)&sixthSimplex);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0xff);
  sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               (long)fifthSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)fifthSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start == 8);
  sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)anon_var_dwarf_94574;
  seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x18146c;
  fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  fifthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_1f0 = "";
  fifthSimplex.second = (double)&seventhSimplex;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector(&fifthSimplex.first,&fifthSimplexVector);
  fifthSimplex.second = 0.2;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&sixthSimplex,
             (vector<int,_std::allocator<int>_> *)&st,(Filtration_value *)&fifthSimplex);
  returnValue.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start;
  returnValue.second =
       (bool)sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish._0_1_;
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            (&returnValue);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            (&st,(int)((ulong)((long)fifthSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)fifthSimplexVector.super__Vector_base<int,_std::allocator<int>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2),
             &fifthSimplex.second);
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_208,0x105);
  seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)CONCAT71(seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start._1_7_,
                                st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 3);
  seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_9455c;
  eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x18143b;
  sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_220 = "";
  sixthSimplex.second = (double)&eighthSimplex;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  poVar8 = std::operator<<((ostream *)&std::clog,"   - INSERT (2,1)");
  std::endl<char,std::char_traits<char>>(poVar8);
  sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x100000002;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&sixthSimplex;
  std::vector<int,_std::allocator<int>_>::vector
            (&sixthSimplexVector,__l_04,(allocator_type *)&seventhSimplex);
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_238,0x10a);
  seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)CONCAT71(seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start._1_7_,
                                (long)sixthSimplexVector.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                                (long)sixthSimplexVector.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start == 8);
  seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_9458d;
  eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x18149d;
  sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  sixthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_250 = "";
  sixthSimplex.second = (double)&eighthSimplex;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector(&sixthSimplex.first,&sixthSimplexVector);
  sixthSimplex.second = 0.2;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&seventhSimplex,
             (vector<int,_std::allocator<int>_> *)&st,(Filtration_value *)&sixthSimplex);
  returnValue.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start;
  returnValue.second =
       (bool)seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish._0_1_;
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            (&returnValue);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            (&st,(int)((ulong)((long)sixthSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)sixthSimplexVector.super__Vector_base<int,_std::allocator<int>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2),
             &sixthSimplex.second);
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_268,0x110);
  eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 3);
  eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_9455c;
  ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x18143b;
  seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)((ulong)seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_280 = "";
  seventhSimplex.second = (double)&ninethSimplex;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  poVar8 = std::operator<<((ostream *)&std::clog,"   - INSERT (2,1,0)");
  std::endl<char,std::char_traits<char>>(poVar8);
  seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x100000002;
  seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)((ulong)seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
  __l_05._M_len = 3;
  __l_05._M_array = (iterator)&seventhSimplex;
  std::vector<int,_std::allocator<int>_>::vector
            (&seventhSimplexVector,__l_05,(allocator_type *)&eighthSimplex);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_298,0x115);
  eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               (long)seventhSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)seventhSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start == 0xc);
  eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_945a7;
  ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x1814d2;
  seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)((ulong)seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  seventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_2b0 = "";
  seventhSimplex.second = (double)&ninethSimplex;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector(&seventhSimplex.first,&seventhSimplexVector);
  seventhSimplex.second = 0.3;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&eighthSimplex,
             (vector<int,_std::allocator<int>_> *)&st,(Filtration_value *)&seventhSimplex);
  returnValue.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start;
  returnValue.second =
       (bool)eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish._0_1_;
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            (&returnValue);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            (&st,(int)((ulong)((long)seventhSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)seventhSimplexVector.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2),&seventhSimplex.second);
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2c8,0x11b);
  ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 3);
  ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_9455c;
  tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x18143b;
  eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_2e0 = "";
  eighthSimplex.second = (double)&tenthSimplex;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  poVar8 = std::operator<<((ostream *)&std::clog,"   - INSERT 3");
  std::endl<char,std::char_traits<char>>(poVar8);
  eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,3);
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&eighthSimplex;
  std::vector<int,_std::allocator<int>_>::vector
            (&eighthSimplexVector,__l_06,(allocator_type *)&ninethSimplex);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f8,0x120);
  ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               (long)eighthSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)eighthSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start == 4);
  ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_945c1;
  tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x181500;
  eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  eighthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_310 = "";
  eighthSimplex.second = (double)&tenthSimplex;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector(&eighthSimplex.first,&eighthSimplexVector);
  eighthSimplex.second = 0.1;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&ninethSimplex,
             (vector<int,_std::allocator<int>_> *)&st,(Filtration_value *)&eighthSimplex);
  returnValue.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start;
  returnValue.second =
       (bool)ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish._0_1_;
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            (&returnValue);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            (&st,(int)((ulong)((long)eighthSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)eighthSimplexVector.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2),&eighthSimplex.second);
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_328,0x126);
  tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 4);
  tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_945ce;
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x181520;
  ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_340 = "";
  ninethSimplex.second = (double)&eleventhSimplex;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  poVar8 = std::operator<<((ostream *)&std::clog,"   - INSERT (3,0)");
  std::endl<char,std::char_traits<char>>(poVar8);
  ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)&ninethSimplex;
  std::vector<int,_std::allocator<int>_>::vector
            (&ninethSimplexVector,__l_07,(allocator_type *)&tenthSimplex);
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_358,299);
  tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               (long)ninethSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)ninethSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start == 8);
  tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_945e8;
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x181552;
  ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  ninethSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_370 = "";
  ninethSimplex.second = (double)&eleventhSimplex;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector(&ninethSimplex.first,&ninethSimplexVector);
  ninethSimplex.second = 0.2;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&tenthSimplex,
             (vector<int,_std::allocator<int>_> *)&st,(Filtration_value *)&ninethSimplex);
  returnValue.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start;
  returnValue.second =
       (bool)tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish._0_1_;
  test_simplex_tree_insert_returns_true<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,bool>>
            (&returnValue);
  set_and_test_simplex_tree_dim_fil<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,double>
            (&st,(int)((ulong)((long)ninethSimplexVector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)ninethSimplexVector.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2),&ninethSimplex.second);
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_388,0x131);
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl
                         .super__Vector_impl_data._M_start._1_7_,
                         st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 4);
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_930 = (undefined1  [8])0x181501;
  local_928 = "";
  tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_3a0 = "";
  tenthSimplex.second = (double)local_930;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  poVar8 = std::operator<<((ostream *)&std::clog,"   - INSERT 0 (already inserted)");
  std::endl<char,std::char_traits<char>>(poVar8);
  tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  __l_08._M_len = 1;
  __l_08._M_array = (iterator)&tenthSimplex;
  std::vector<int,_std::allocator<int>_>::vector
            (&tenthSimplexVector,__l_08,(allocator_type *)&eleventhSimplex);
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3b8,0x136);
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl
                         .super__Vector_impl_data._M_start._1_7_,
                         (long)tenthSimplexVector.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)tenthSimplexVector.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start == 4);
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_930 = (undefined1  [8])0x181574;
  local_928 = "";
  tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  tenthSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_3d0 = "";
  tenthSimplex.second = (double)local_930;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector(&tenthSimplex.first,&tenthSimplexVector);
  tenthSimplex.second = 0.4;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&eleventhSimplex,
             (vector<int,_std::allocator<int>_> *)&st,(Filtration_value *)&tenthSimplex);
  returnValue.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start;
  returnValue.second =
       (bool)eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish._0_1_;
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3e8,0x13b);
  local_930 = (undefined1  [8])(CONCAT71(local_930._1_7_,returnValue.second) ^ 1);
  local_928 = (char *)0x0;
  _Stack_920._M_nxt = (_Hash_node_base *)0x0;
  eleventhSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_9460f;
  eleventhSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1815ae;
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_400 = "";
  eleventhSimplex.second = (double)&eleventhSimplexVector;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_920);
  vVar2 = returnValue.first;
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_418,0x13e);
  local_928 = (char *)0x0;
  _Stack_920._M_nxt = (_Hash_node_base *)0x0;
  eleventhSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_9461c;
  eleventhSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1815d3;
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_430 = "";
  eleventhSimplex.second = (double)&eleventhSimplexVector;
  local_930[0] = (allocator_type)
                 (vVar2.m_ptr ==
                 (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                  *)0x0);
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_920);
  poVar8 = std::operator<<((ostream *)&std::clog,"st.num_vertices()=");
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::endl<char,std::char_traits<char>>(poVar8);
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_448,0x140);
  local_930[0] = (allocator_type)(st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 4);
  local_928 = (char *)0x0;
  _Stack_920._M_nxt = (_Hash_node_base *)0x0;
  eleventhSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_945ce;
  eleventhSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x181520;
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_460 = "";
  eleventhSimplex.second = (double)&eleventhSimplexVector;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_920);
  local_478 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_478,0x141);
  iVar7 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st);
  local_930[0] = (allocator_type)(iVar7 == dim_max);
  local_928 = (char *)0x0;
  _Stack_920._M_nxt = (_Hash_node_base *)0x0;
  eleventhSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_94644;
  eleventhSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x181600;
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_490 = "";
  eleventhSimplex.second = (double)&eleventhSimplexVector;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_920);
  poVar8 = std::operator<<((ostream *)&std::clog,"   - INSERT (2,1,0) (already inserted)");
  std::endl<char,std::char_traits<char>>(poVar8);
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x100000002;
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffff00000000);
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)&eleventhSimplex;
  std::vector<int,_std::allocator<int>_>::vector
            (&eleventhSimplexVector,__l_09,(allocator_type *)local_930);
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4a8,0x146);
  local_930[0] = (allocator_type)
                 ((long)eleventhSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)eleventhSimplexVector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start == 0xc);
  local_928 = (char *)0x0;
  _Stack_920._M_nxt = (_Hash_node_base *)0x0;
  eleventhSimplex.second = (double)&local_830;
  local_830 = (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
               *)0x181628;
  local_828 = (pointer)0x181649;
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_001c1f38;
  eleventhSimplex.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_4c0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&_Stack_920);
  std::vector<int,_std::allocator<int>_>::vector(&eleventhSimplex.first,&eleventhSimplexVector);
  eleventhSimplex.second = 0.4;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex<std::vector<int,std::allocator<int>>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_930,
             (vector<int,_std::allocator<int>_> *)&st,(Filtration_value *)&eleventhSimplex);
  returnValue.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)local_930;
  returnValue.second = (bool)local_928._0_1_;
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4d8,0x14a);
  local_830 = (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
               *)(CONCAT71(local_830._1_7_,returnValue.second) ^ 1);
  local_828 = (pointer)0x0;
  sStack_820.pi_ = (sp_counted_base *)0x0;
  local_7c0._M_impl.super__Vector_impl_data._M_start = (pointer)0x181593;
  local_7c0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1815ae;
  local_928 = (char *)((ulong)local_928 & 0xffffffffffffff00);
  local_930 = (undefined1  [8])&PTR__lazy_ostream_001c1f38;
  _Stack_920._M_nxt = (_Hash_node_base *)&boost::unit_test::lazy_ostream::inst;
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_4f0 = "";
  local_918 = &local_7c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_820);
  vVar2 = returnValue.first;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_508,0x14d);
  local_828 = (pointer)0x0;
  sStack_820.pi_ = (sp_counted_base *)0x0;
  local_7c0._M_impl.super__Vector_impl_data._M_start = (pointer)0x1815af;
  local_7c0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1815d3;
  local_928 = (char *)((ulong)local_928 & 0xffffffffffffff00);
  local_930 = (undefined1  [8])&PTR__lazy_ostream_001c1f38;
  _Stack_920._M_nxt = (_Hash_node_base *)&boost::unit_test::lazy_ostream::inst;
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_520 = "";
  local_918 = &local_7c0;
  local_830._0_1_ =
       vVar2.m_ptr ==
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)0x0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_820);
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_530 = "";
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_538,0x14e);
  local_830._0_1_ = st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 4;
  local_828 = (pointer)0x0;
  sStack_820.pi_ = (sp_counted_base *)0x0;
  local_7c0._M_impl.super__Vector_impl_data._M_start = (pointer)0x181501;
  local_7c0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x181520;
  local_928 = (char *)((ulong)local_928 & 0xffffffffffffff00);
  local_930 = (undefined1  [8])&PTR__lazy_ostream_001c1f38;
  _Stack_920._M_nxt = (_Hash_node_base *)&boost::unit_test::lazy_ostream::inst;
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_550 = "";
  local_918 = &local_7c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_820);
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_568,0x14f);
  iVar7 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st);
  local_830._0_1_ = iVar7 == dim_max;
  local_828 = (pointer)0x0;
  sStack_820.pi_ = (sp_counted_base *)0x0;
  local_7c0._M_impl.super__Vector_impl_data._M_start = (pointer)0x1815e7;
  local_7c0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x181600;
  local_928 = (char *)((ulong)local_928 & 0xffffffffffffff00);
  local_930 = (undefined1  [8])&PTR__lazy_ostream_001c1f38;
  _Stack_920._M_nxt = (_Hash_node_base *)&boost::unit_test::lazy_ostream::inst;
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_580 = "";
  local_918 = &local_7c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_820);
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_598,0x150);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices_by_dimension
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_7c0,&st);
  local_48[0] = 4;
  local_48[1] = 4;
  local_48[2] = 1;
  __l_10._M_len = 3;
  __l_10._M_array = local_48;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_5e0,__l_10,&local_931);
  bVar6 = std::operator==((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_7c0,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_5e0);
  local_830 = (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
               *)CONCAT71(local_830._1_7_,bVar6);
  local_828 = (pointer)0x0;
  sStack_820.pi_ = (sp_counted_base *)0x0;
  local_918 = (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_5b8;
  local_5b8._M_nxt = (_Hash_node_base *)0x18164a;
  local_5b0 = "";
  local_928 = (char *)((ulong)local_928 & 0xffffffffffffff00);
  local_930 = (undefined1  [8])&PTR__lazy_ostream_001c1f38;
  _Stack_920._M_nxt = (_Hash_node_base *)&boost::unit_test::lazy_ostream::inst;
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_5c0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_820);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_5e0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_7c0);
  poVar8 = std::operator<<((ostream *)&std::clog,"simplex_tree_insertion - first - 0");
  std::endl<char,std::char_traits<char>>(poVar8);
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            (&st,&firstSimplex,0);
  poVar8 = std::operator<<((ostream *)&std::clog,"simplex_tree_insertion - second - 1");
  std::endl<char,std::char_traits<char>>(poVar8);
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            (&st,&secondSimplex,1);
  poVar8 = std::operator<<((ostream *)&std::clog,"simplex_tree_insertion - third - 4");
  std::endl<char,std::char_traits<char>>(poVar8);
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            (&st,&thirdSimplex,4);
  poVar8 = std::operator<<((ostream *)&std::clog,"simplex_tree_insertion - fourth - 2");
  std::endl<char,std::char_traits<char>>(poVar8);
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            (&st,&fourthSimplex,2);
  poVar8 = std::operator<<((ostream *)&std::clog,"simplex_tree_insertion - fifth - 5");
  std::endl<char,std::char_traits<char>>(poVar8);
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            (&st,&fifthSimplex,5);
  poVar8 = std::operator<<((ostream *)&std::clog,"simplex_tree_insertion - sixth - 6");
  std::endl<char,std::char_traits<char>>(poVar8);
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            (&st,&sixthSimplex,6);
  poVar8 = std::operator<<((ostream *)&std::clog,"simplex_tree_insertion - seventh - 8");
  std::endl<char,std::char_traits<char>>(poVar8);
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            (&st,&seventhSimplex,8);
  poVar8 = std::operator<<((ostream *)&std::clog,"simplex_tree_insertion - eighth - 3");
  std::endl<char,std::char_traits<char>>(poVar8);
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            (&st,&eighthSimplex,3);
  poVar8 = std::operator<<((ostream *)&std::clog,"simplex_tree_insertion - ninth - 7");
  std::endl<char,std::char_traits<char>>(poVar8);
  test_simplex_tree_contains<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,std::pair<std::vector<int,std::allocator<int>>,double>>
            (&st,&ninethSimplex,7);
  poVar8 = std::operator<<((ostream *)&std::clog,"The complex contains ");
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices(&st);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  poVar8 = std::operator<<(poVar8," simplices");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&std::clog,"   - dimension ");
  iVar7 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar7);
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
  poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<(poVar8,
                           "Iterator on Simplices in the filtration, with [filtration value]:");
  std::endl<char,std::char_traits<char>>(poVar8);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::maybe_initialize_filtration(&st);
  pvVar5 = st.filtration_vect_.
           super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar11 = st.filtration_vect_.
                 super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pvVar11 != pvVar5; pvVar11 = pvVar11 + 1
      ) {
    ppVar1 = pvVar11->m_ptr;
    poVar8 = std::operator<<((ostream *)&std::clog,"   ");
    std::operator<<(poVar8,"[");
    pFVar9 = (Filtration_value *)&ppVar1->second;
    if (ppVar1 == (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
                   *)0x0) {
      pFVar9 = &Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
                Filtration_simplex_base_real::inf_;
    }
    poVar8 = std::ostream::_M_insert<double>
                       ((((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
                           *)pFVar9)->super_Filtration_simplex_base).filt_);
    std::operator<<(poVar8,"] ");
    __return_storage_ptr__ = (Siblings *)local_930;
    local_620.m_ptr = ppVar1;
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::simplex_vertex_range
              ((Simplex_vertex_range *)__return_storage_ptr__,&st,&local_620);
    _Var3._M_nxt = _Stack_920._M_nxt;
    fVar4 = local_918._0_4_;
    fVar10 = local_928._0_4_;
    while ((__return_storage_ptr__ =
                 (((iterator_range_base<Gudhi::Simplex_tree_simplex_vertex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_boost::iterators::incrementable_traversal_tag>
                    *)&__return_storage_ptr__->oncles_)->m_Begin).sib_,
           __return_storage_ptr__ != (Siblings *)_Var3._M_nxt || (fVar10 != fVar4))) {
      poVar8 = (ostream *)std::ostream::operator<<(&std::clog,(int)fVar10);
      std::operator<<(poVar8," ");
      fVar10 = (float)__return_storage_ptr__->parent_;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&eleventhSimplex);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&eleventhSimplexVector.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&tenthSimplex);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&tenthSimplexVector.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&ninethSimplex);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&ninethSimplexVector.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&eighthSimplex);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&eighthSimplexVector.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&seventhSimplex);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&seventhSimplexVector.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&sixthSimplex);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&sixthSimplexVector.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&fifthSimplex);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&fifthSimplexVector.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&fourthSimplex);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&fourthSimplexVector.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&thirdSimplex);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&thirdSimplexVector.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&secondSimplex);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&secondSimplexVector.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&firstSimplex);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&firstSimplexVector.super__Vector_base<int,_std::allocator<int>_>);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::~Simplex_tree(&st);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(simplex_tree_insertion, typeST, list_of_tested_variants) {
  typedef typename typeST::Filtration_value Filtration_value;
  typedef std::pair<typename typeST::Simplex_handle, bool> typePairSimplexBool;
  typedef std::vector<typename typeST::Vertex_handle> typeVectorVertex;
  typedef std::pair<typeVectorVertex, Filtration_value> typeSimplex;
  const Filtration_value FIRST_FILTRATION_VALUE = 0.1;
  const Filtration_value SECOND_FILTRATION_VALUE = 0.2;
  const Filtration_value THIRD_FILTRATION_VALUE = 0.3;
  const Filtration_value FOURTH_FILTRATION_VALUE = 0.4;
  // reset since we run the test several times
  dim_max = -1;

  // TEST OF INSERTION
  std::clog << "********************************************************************" << std::endl;
  std::clog << "TEST OF INSERTION" << std::endl;
  typeST st;

  // ++ FIRST
  std::clog << "   - INSERT 0" << std::endl;
  typeVectorVertex firstSimplexVector{0};
  BOOST_CHECK(firstSimplexVector.size() == 1);
  typeSimplex firstSimplex = std::make_pair(firstSimplexVector, Filtration_value(FIRST_FILTRATION_VALUE));
  typePairSimplexBool returnValue = st.insert_simplex(firstSimplex.first, firstSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, firstSimplexVector.size(), firstSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 1);

  // ++ SECOND
  std::clog << "   - INSERT 1" << std::endl;
  typeVectorVertex secondSimplexVector{1};
  BOOST_CHECK(secondSimplexVector.size() == 1);
  typeSimplex secondSimplex = std::make_pair(secondSimplexVector, Filtration_value(FIRST_FILTRATION_VALUE));
  returnValue = st.insert_simplex(secondSimplex.first, secondSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, secondSimplexVector.size(), secondSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 2);

  // ++ THIRD
  std::clog << "   - INSERT (0,1)" << std::endl;
  typeVectorVertex thirdSimplexVector{0, 1};
  BOOST_CHECK(thirdSimplexVector.size() == 2);
  typeSimplex thirdSimplex = std::make_pair(thirdSimplexVector, Filtration_value(SECOND_FILTRATION_VALUE));
  returnValue = st.insert_simplex(thirdSimplex.first, thirdSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, thirdSimplexVector.size(), thirdSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 2); // Not incremented !!

  // ++ FOURTH
  std::clog << "   - INSERT 2" << std::endl;
  typeVectorVertex fourthSimplexVector{2};
  BOOST_CHECK(fourthSimplexVector.size() == 1);
  typeSimplex fourthSimplex = std::make_pair(fourthSimplexVector, Filtration_value(FIRST_FILTRATION_VALUE));
  returnValue = st.insert_simplex(fourthSimplex.first, fourthSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, fourthSimplexVector.size(), fourthSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 3);

  // ++ FIFTH
  std::clog << "   - INSERT (2,0)" << std::endl;
  typeVectorVertex fifthSimplexVector{2, 0};
  BOOST_CHECK(fifthSimplexVector.size() == 2);
  typeSimplex fifthSimplex = std::make_pair(fifthSimplexVector, Filtration_value(SECOND_FILTRATION_VALUE));
  returnValue = st.insert_simplex(fifthSimplex.first, fifthSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, fifthSimplexVector.size(), fifthSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 3); // Not incremented !!

  // ++ SIXTH
  std::clog << "   - INSERT (2,1)" << std::endl;
  typeVectorVertex sixthSimplexVector{2, 1};
  BOOST_CHECK(sixthSimplexVector.size() == 2);
  typeSimplex sixthSimplex = std::make_pair(sixthSimplexVector, Filtration_value(SECOND_FILTRATION_VALUE));
  returnValue = st.insert_simplex(sixthSimplex.first, sixthSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, sixthSimplexVector.size(), sixthSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 3); // Not incremented !!

  // ++ SEVENTH
  std::clog << "   - INSERT (2,1,0)" << std::endl;
  typeVectorVertex seventhSimplexVector{2, 1, 0};
  BOOST_CHECK(seventhSimplexVector.size() == 3);
  typeSimplex seventhSimplex = std::make_pair(seventhSimplexVector, Filtration_value(THIRD_FILTRATION_VALUE));
  returnValue = st.insert_simplex(seventhSimplex.first, seventhSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, seventhSimplexVector.size(), seventhSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 3); // Not incremented !!

  // ++ EIGHTH
  std::clog << "   - INSERT 3" << std::endl;
  typeVectorVertex eighthSimplexVector{3};
  BOOST_CHECK(eighthSimplexVector.size() == 1);
  typeSimplex eighthSimplex = std::make_pair(eighthSimplexVector, Filtration_value(FIRST_FILTRATION_VALUE));
  returnValue = st.insert_simplex(eighthSimplex.first, eighthSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, eighthSimplexVector.size(), eighthSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 4);

  // ++ NINTH
  std::clog << "   - INSERT (3,0)" << std::endl;
  typeVectorVertex ninethSimplexVector{3, 0};
  BOOST_CHECK(ninethSimplexVector.size() == 2);
  typeSimplex ninethSimplex = std::make_pair(ninethSimplexVector, Filtration_value(SECOND_FILTRATION_VALUE));
  returnValue = st.insert_simplex(ninethSimplex.first, ninethSimplex.second);

  test_simplex_tree_insert_returns_true<typeST>(returnValue);
  set_and_test_simplex_tree_dim_fil(st, ninethSimplexVector.size(), ninethSimplex.second);
  BOOST_CHECK(st.num_vertices() == (size_t) 4); // Not incremented !!

  // ++ TENTH
  std::clog << "   - INSERT 0 (already inserted)" << std::endl;
  typeVectorVertex tenthSimplexVector{0};
  BOOST_CHECK(tenthSimplexVector.size() == 1);
  // With a different filtration value
  typeSimplex tenthSimplex = std::make_pair(tenthSimplexVector, Filtration_value(FOURTH_FILTRATION_VALUE));
  returnValue = st.insert_simplex(tenthSimplex.first, tenthSimplex.second);

  BOOST_CHECK(returnValue.second == false);
  // Simplex_handle = boost::container::flat_map< typeST::Vertex_handle, Node >::iterator
  typename typeST::Simplex_handle shReturned = returnValue.first;
  BOOST_CHECK(shReturned == typeST::null_simplex());
  std::clog << "st.num_vertices()=" << st.num_vertices() << std::endl;
  BOOST_CHECK(st.num_vertices() == (size_t) 4); // Not incremented !!
  BOOST_CHECK(st.dimension() == dim_max);

  // ++ ELEVENTH
  std::clog << "   - INSERT (2,1,0) (already inserted)" << std::endl;
  typeVectorVertex eleventhSimplexVector{2, 1, 0};
  BOOST_CHECK(eleventhSimplexVector.size() == 3);
  typeSimplex eleventhSimplex = std::make_pair(eleventhSimplexVector, Filtration_value(FOURTH_FILTRATION_VALUE));
  returnValue = st.insert_simplex(eleventhSimplex.first, eleventhSimplex.second);

  BOOST_CHECK(returnValue.second == false);
  // Simplex_handle = boost::container::flat_map< typeST::Vertex_handle, Node >::iterator
  shReturned = returnValue.first;
  BOOST_CHECK(shReturned == typeST::null_simplex());
  BOOST_CHECK(st.num_vertices() == (size_t) 4); // Not incremented !!
  BOOST_CHECK(st.dimension() == dim_max);
  BOOST_CHECK(st.num_simplices_by_dimension() == std::vector<size_t>({4, 4, 1}));

  /* Inserted simplex:        */
  /*    1                     */
  /*    o                     */
  /*   /X\                    */
  /*  o---o---o               */
  /*  2   0   3               */

  //   [0.1] 0
  //   [0.1] 1
  //   [0.1] 2
  //   [0.1] 3
  //   [0.2] 1 0
  //   [0.2] 2 0
  //   [0.2] 2 1
  //   [0.2] 3 0
  //   [0.3] 2 1 0
  //  !! Be careful, simplex are sorted by filtration value on insertion !!
  std::clog << "simplex_tree_insertion - first - 0" << std::endl;
  test_simplex_tree_contains(st, firstSimplex, 0); // (0) -> 0
  std::clog << "simplex_tree_insertion - second - 1" << std::endl;
  test_simplex_tree_contains(st, secondSimplex, 1); // (1) -> 1
  std::clog << "simplex_tree_insertion - third - 4" << std::endl;
  test_simplex_tree_contains(st, thirdSimplex, 4); // (0,1) -> 4
  std::clog << "simplex_tree_insertion - fourth - 2" << std::endl;
  test_simplex_tree_contains(st, fourthSimplex, 2); // (2) -> 2
  std::clog << "simplex_tree_insertion - fifth - 5" << std::endl;
  test_simplex_tree_contains(st, fifthSimplex, 5); // (2,0) -> 5
  std::clog << "simplex_tree_insertion - sixth - 6" << std::endl;
  test_simplex_tree_contains(st, sixthSimplex, 6); //(2,1) -> 6
  std::clog << "simplex_tree_insertion - seventh - 8" << std::endl;
  test_simplex_tree_contains(st, seventhSimplex, 8); // (2,1,0) -> 8
  std::clog << "simplex_tree_insertion - eighth - 3" << std::endl;
  test_simplex_tree_contains(st, eighthSimplex, 3); // (3) -> 3
  std::clog << "simplex_tree_insertion - ninth - 7" << std::endl;
  test_simplex_tree_contains(st, ninethSimplex, 7); // (3,0) -> 7

  // Display the Simplex_tree - Can not be done in the middle of 2 inserts
  std::clog << "The complex contains " << st.num_simplices() << " simplices" << std::endl;
  std::clog << "   - dimension " << st.dimension() << std::endl;
  std::clog << std::endl << std::endl << "Iterator on Simplices in the filtration, with [filtration value]:" << std::endl;
  for (auto f_simplex : st.filtration_simplex_range()) {
    std::clog << "   " << "[" << st.filtration(f_simplex) << "] ";
    for (auto vertex : st.simplex_vertex_range(f_simplex)) {
      std::clog << (int) vertex << " ";
    }
    std::clog << std::endl;
  }

}